

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

bool libcellml::isNameChar(uint32_t nameChar)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = isNameStartChar(nameChar);
  bVar2 = true;
  if ((((9 < nameChar - 0x30 && !bVar1) && (1 < nameChar - 0x2d)) && (nameChar != 0xc2b7)) &&
     (0x12f < nameChar - 0xcc80)) {
    bVar2 = nameChar - 0xe280bf < 0xc2;
  }
  return bVar2;
}

Assistant:

bool isNameChar(uint32_t nameChar)
{
    if (isNameStartChar(nameChar)) {
        return true;
    }

    // "-" | "." | [0-9] | #xB7 | [#x0300-#x036F] | [#x203F-#x2040]
    return ((0x30U <= nameChar) && (nameChar <= 0x39U))
           || (nameChar == 0x2DU)
           || (nameChar == 0x2EU)
           || (nameChar == 0xC2B7U)
           || ((0xCC80U <= nameChar) && (nameChar <= 0xCDAFU))
           || ((0xE280BFU <= nameChar) && (nameChar <= 0xE28180U));
}